

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_inexact_sqrt(sexp ctx,sexp self,sexp_sint_t n,sexp z)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  ulong uVar4;
  sexp psVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RDI;
  double dVar6;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  double r;
  double d;
  int negativep;
  sexp in_stack_ffffffffffffffa0;
  sexp in_stack_ffffffffffffffa8;
  sexp_uint_t in_stack_ffffffffffffffb0;
  sexp ctx_00;
  sexp psVar7;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 local_38;
  
  psVar7 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffa8,0,0x10);
  if (((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 0xb)) {
    local_38 = (((sexp)in_RCX)->value).flonum;
  }
  else if ((in_RCX & 1) == 1) {
    auVar1._8_8_ = (long)in_RCX >> 0x3f;
    auVar1._0_8_ = in_RCX & 0xfffffffffffffffe;
    local_38 = (undefined8)SUB168(auVar1 / SEXT816(2),0);
  }
  else {
    if (((in_RCX & 3) != 0) || (((sexp)in_RCX)->tag != 0xd)) {
      if (((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 0xe)) {
        psVar7 = sexp_complex_sqrt((sexp)in_RDX,(sexp)in_RCX);
        psVar7 = sexp_complex_normalize(psVar7);
        return psVar7;
      }
      psVar7 = sexp_type_exception((sexp)in_stack_ffffffffffffffc0,psVar7,in_stack_ffffffffffffffb0,
                                   in_stack_ffffffffffffffa8);
      return psVar7;
    }
    local_38 = sexp_ratio_to_double((sexp)in_RDX,(sexp)in_RCX);
  }
  bVar3 = (double)local_38 < 0.0;
  if (bVar3) {
    local_38 = local_38 ^ 0x8000000000000000;
  }
  psVar7 = (sexp)&stack0xffffffffffffffb8;
  ctx_00 = *(sexp *)(in_RDI + 0x6080);
  *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffa8;
  dVar6 = sqrt((double)local_38);
  if ((in_RCX & 1) == 1) {
    uVar4 = (long)dVar6 | (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f;
    in_stack_ffffffffffffffa0 = (sexp)(uVar4 * uVar4);
    auVar2._8_8_ = (long)in_RCX >> 0x3f;
    auVar2._0_8_ = in_RCX & 0xfffffffffffffffe;
    psVar5 = SUB168(auVar2 / SEXT816(2),0);
    if ((long)psVar5 < 1) {
      psVar5 = (sexp)-(long)psVar5;
    }
    if (in_stack_ffffffffffffffa0 == psVar5) {
      dVar6 = round(dVar6);
      psVar5 = (sexp)((long)dVar6 << 1 | 1);
      goto LAB_0014c0a9;
    }
  }
  psVar5 = sexp_make_flonum(psVar7,(double)in_stack_ffffffffffffffa0);
LAB_0014c0a9:
  if (bVar3) {
    psVar5 = sexp_make_complex(ctx_00,psVar7,in_stack_ffffffffffffffa0);
  }
  *(sexp *)(in_RDI + 0x6080) = ctx_00;
  return psVar5;
}

Assistant:

sexp sexp_inexact_sqrt (sexp ctx, sexp self, sexp_sint_t n, sexp z) {
#if SEXP_USE_COMPLEX
  int negativep = 0;
#endif
  double d, r;
  sexp_gc_var1(res);
  if (sexp_flonump(z))
    d = sexp_flonum_value(z);
  else if (sexp_fixnump(z))
    d = (double)sexp_unbox_fixnum(z); /* may be larger or smaller than z */
  maybe_convert_ratio(ctx, z)         /* TODO: add ratio sqrt */
  maybe_convert_complex(z, sexp_complex_sqrt)
  else
    return sexp_type_exception(ctx, self, SEXP_NUMBER, z);
#if SEXP_USE_COMPLEX
  if (d < 0) {
    negativep = 1;
    d = -d;
  }
#endif
  sexp_gc_preserve1(ctx, res);
  r = sqrt(d);
  if (sexp_fixnump(z)
      && (((sexp_uint_t)r*(sexp_uint_t)r)==labs(sexp_unbox_fixnum(z))))
    res = sexp_make_fixnum(round(r));
  else
    res = sexp_make_flonum(ctx, r);
#if SEXP_USE_COMPLEX
  if (negativep)
    res = sexp_make_complex(ctx, SEXP_ZERO, res);
#endif
  sexp_gc_release1(ctx);
  return res;
}